

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<spirv_cross::HLSLVertexAttributeRemap,_8UL>::SmallVector
          (SmallVector<spirv_cross::HLSLVertexAttributeRemap,_8UL> *this)

{
  HLSLVertexAttributeRemap *pHVar1;
  SmallVector<spirv_cross::HLSLVertexAttributeRemap,_8UL> *this_local;
  
  VectorView<spirv_cross::HLSLVertexAttributeRemap>::VectorView
            (&this->super_VectorView<spirv_cross::HLSLVertexAttributeRemap>);
  this->buffer_capacity = 0;
  pHVar1 = AlignedBuffer<spirv_cross::HLSLVertexAttributeRemap,_8UL>::data(&this->stack_storage);
  (this->super_VectorView<spirv_cross::HLSLVertexAttributeRemap>).ptr = pHVar1;
  this->buffer_capacity = 8;
  return;
}

Assistant:

SmallVector() SPIRV_CROSS_NOEXCEPT
	{
		this->ptr = stack_storage.data();
		buffer_capacity = N;
	}